

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_sll(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  BtorSimBitVector *pBVar4;
  
  uVar1 = b->width;
  if (uVar1 < 0x41) {
    uVar3 = btorsim_bv_to_uint64(b);
    uVar2 = (uint32_t)uVar3;
  }
  else {
    uVar2 = btorsim_bv_get_num_leading_zeros(b);
    if (uVar2 < uVar1 - 0x40) {
      pBVar4 = btorsim_bv_new(a->width);
      return pBVar4;
    }
    pBVar4 = btorsim_bv_slice(b,0x3f,0);
    uVar3 = btorsim_bv_to_uint64(pBVar4);
    uVar2 = (uint32_t)uVar3;
    free(pBVar4);
  }
  pBVar4 = sll_bv(a,uVar2);
  return pBVar4;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sll (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint64_t shift;
  BtorSimBitVector *res;
  if (b->width <= 64)
    shift = btorsim_bv_to_uint64 (b);
  else
  {
    if (btorsim_bv_get_num_leading_zeros (b) < (b->width - 64))
      return btorsim_bv_new (a->width);
    BtorSimBitVector *lower = btorsim_bv_slice (b, 63, 0);
    shift                   = btorsim_bv_to_uint64 (lower);
    btorsim_bv_free (lower);
  }
  res = sll_bv (a, shift);
  return res;
}